

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O1

void clear_char(CHAR_DATA *ch)

{
  memset(ch,0,0x340);
  ch->name = str_empty;
  ch->short_descr = str_empty;
  ch->long_descr = str_empty;
  ch->description = str_empty;
  ch->prompt = str_empty;
  ch->logon = current_time;
  ch->lines = 0x14;
  ch->armor[0] = 0;
  ch->armor[1] = 0;
  ch->armor[2] = 0;
  ch->armor[3] = 0;
  ch->position = 8;
  ch->hit = 0x14;
  ch->max_hit = 0x14;
  ch->mana = 100;
  ch->max_mana = 100;
  ch->move = 100;
  ch->max_move = 100;
  ch->last_fought = (CHAR_DATA *)0x0;
  ch->on = (OBJ_DATA *)0x0;
  ch->hometown = 0;
  ch->last_fight_time = 0;
  ch->last_fight_name = (char *)0x0;
  ch->arms = 2;
  ch->legs = 2;
  ch->balance = 0;
  ch->regen_rate = 0;
  ch->ghost = 0;
  return;
}

Assistant:

void clear_char(CHAR_DATA *ch)
{
	static CHAR_DATA ch_zero;
	int i;

	*ch = ch_zero;
	ch->name = &str_empty[0];
	ch->short_descr = &str_empty[0];
	ch->long_descr = &str_empty[0];
	ch->description = &str_empty[0];
	ch->prompt = &str_empty[0];
	ch->logon = current_time;
	ch->lines = PAGELEN;

	for (i = 0; i < 4; i++)
	{
		ch->armor[i] = 0;
	}

	ch->position = POS_STANDING;
	ch->hit = 20;
	ch->max_hit = 20;
	ch->mana = 100;
	ch->max_mana = 100;
	ch->move = 100;
	ch->max_move = 100;
	ch->last_fought = nullptr;
	ch->last_fight_time = 0;
	ch->last_fight_name = nullptr;
	ch->on = nullptr;
	ch->hometown = 0;
	ch->arms = 2;
	ch->legs = 2;
	ch->balance = 0;
	ch->regen_rate = 0;
	ch->ghost = 0;
}